

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::DecodePendingOperationalDataset
                  (Error *__return_storage_ptr__,PendingOperationalDataset *aDataset,
                  Response *aResponse)

{
  ErrorCode EVar1;
  Error *pEVar2;
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ByteArray *pBVar4;
  unsigned_long aValue;
  mapped_type delayTimer;
  TlvSet tlvSet;
  PendingOperationalDataset dataset;
  key_type local_159;
  undefined1 local_158 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150 [4];
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_130;
  PendingOperationalDataset local_100;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130._M_impl.super__Rb_tree_header._M_header;
  local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  PendingOperationalDataset::PendingOperationalDataset(&local_100);
  local_100.super_ActiveOperationalDataset.mPresentFlags = 0;
  DecodeActiveOperationalDataset
            ((Error *)local_158,&local_100.super_ActiveOperationalDataset,&aResponse->mPayload);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_158);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)local_150);
  if (EVar1 == kNone) {
    tlv::GetTlvSet((Error *)local_158,(TlvSet *)&local_130,&aResponse->mPayload,kMeshCoP);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_158);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)local_150);
    if (EVar1 == kNone) {
      local_159 = kDelayTimer;
      p_Var3 = &std::
                map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                              *)&local_130,&local_159)->
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_158,
                 p_Var3);
      if (local_158 != (undefined1  [8])0x0) {
        pBVar4 = tlv::Tlv::GetValue((Tlv *)local_158);
        local_100.super_ActiveOperationalDataset._212_4_ = utils::Decode<unsigned_int>(pBVar4);
        local_100.super_ActiveOperationalDataset.mPresentFlags =
             local_100.super_ActiveOperationalDataset.mPresentFlags | 0x20;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
      local_159 = kPendingTimestamp;
      p_Var3 = &std::
                map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                              *)&local_130,&local_159)->
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_158,
                 p_Var3);
      if (local_158 != (undefined1  [8])0x0) {
        pBVar4 = tlv::Tlv::GetValue((Tlv *)local_158);
        aValue = utils::Decode<unsigned_long>(pBVar4);
        local_100.mPendingTimestamp = Timestamp::Decode(aValue);
        local_100.super_ActiveOperationalDataset.mPresentFlags =
             local_100.super_ActiveOperationalDataset.mPresentFlags | 0x10;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
      PendingOperationalDataset::operator=(aDataset,&local_100);
    }
  }
  ActiveOperationalDataset::~ActiveOperationalDataset(&local_100.super_ActiveOperationalDataset);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_130);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodePendingOperationalDataset(PendingOperationalDataset &aDataset,
                                                        const coap::Response      &aResponse)
{
    Error                     error;
    tlv::TlvSet               tlvSet;
    PendingOperationalDataset dataset;

    // Clear all data fields
    dataset.mPresentFlags = 0;

    SuccessOrExit(error = DecodeActiveOperationalDataset(dataset, aResponse.GetPayload()));
    SuccessOrExit(error = GetTlvSet(tlvSet, aResponse));

    if (auto delayTimer = tlvSet[tlv::Type::kDelayTimer])
    {
        dataset.mDelayTimer = utils::Decode<uint32_t>(delayTimer->GetValue());
        dataset.mPresentFlags |= PendingOperationalDataset::kDelayTimerBit;
    }

    if (auto pendingTimestamp = tlvSet[tlv::Type::kPendingTimestamp])
    {
        uint64_t value;
        value                     = utils::Decode<uint64_t>(pendingTimestamp->GetValue());
        dataset.mPendingTimestamp = Timestamp::Decode(value);
        dataset.mPresentFlags |= PendingOperationalDataset::kPendingTimestampBit;
    }

    aDataset = dataset;

exit:
    return error;
}